

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_shl__Test::TestBody(correctness_shl__Test *this)

{
  bool bVar1;
  internal iVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  big_integer a;
  AssertHelper local_100;
  Message local_f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_e8 [56];
  undefined1 local_b0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8 [6];
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_78,0x17);
  big_integer::big_integer(&local_40,&local_78);
  ::operator<<((big_integer *)local_e8,&local_40,5);
  big_integer::big_integer((big_integer *)local_b0,0x2e0);
  local_f8.ss_.ptr_._0_1_ = (internal)operator==((big_integer *)local_e8,(big_integer *)local_b0);
  local_f0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  big_integer::~big_integer((big_integer *)local_b0);
  big_integer::~big_integer((big_integer *)local_e8);
  big_integer::~big_integer(&local_40);
  if (local_f8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,(AssertionResult *)"(a << 5) == 23 * 32",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x196,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (CONCAT71(local_b0._1_7_,local_b0[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::operator<<=(&local_78,5);
  big_integer::big_integer((big_integer *)local_e8,0x2e0);
  iVar2 = (internal)operator==(&local_78,(big_integer *)local_e8);
  local_a8[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0[0] = iVar2;
  big_integer::~big_integer((big_integer *)local_e8);
  if (!(bool)iVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_b0,(AssertionResult *)"a == 23 * 32","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x199,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (CONCAT71(local_f8.ss_.ptr_._1_7_,local_f8.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_f8.ss_.ptr_._1_7_,local_f8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_f8.ss_.ptr_._1_7_,local_f8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  return;
}

Assistant:

TEST(correctness, shl_)
{
    big_integer a = 23;

    EXPECT_TRUE((a << 5) == 23 * 32);

    a <<= 5;
    EXPECT_TRUE(a == 23 * 32);
}